

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_path.c
# Opt level: O1

int portability_path_compare(char *left_path,char *right_path)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  uint uVar4;
  
  uVar4 = 1;
  if (right_path != (char *)0x0 && left_path != (char *)0x0) {
    sVar2 = strlen(left_path);
    sVar3 = strlen(right_path);
    if ((sVar3 != 0 && sVar2 != 0) &&
       (sVar2 = sVar2 - (left_path[sVar2 - 1] == '/'),
       sVar2 == sVar3 - (right_path[sVar3 - 1] == '/'))) {
      iVar1 = strncmp(left_path,right_path,sVar2);
      uVar4 = (uint)(iVar1 != 0);
    }
  }
  return uVar4;
}

Assistant:

int portability_path_compare(const char *left_path, const char *right_path)
{
	if (left_path == NULL || right_path == NULL)
	{
		return 1;
	}

	size_t left_length = strlen(left_path);
	size_t right_length = strlen(right_path);

	if (left_length == 0 || right_length == 0)
	{
		return 1;
	}

	if (PORTABILITY_PATH_SEPARATOR(left_path[left_length - 1]))
	{
		--left_length;
	}

	if (PORTABILITY_PATH_SEPARATOR(right_path[right_length - 1]))
	{
		--right_length;
	}

	if (left_length != right_length)
	{
		return 1;
	}

	return (strncmp(left_path, right_path, left_length) != 0);
}